

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O2

bool setOptionInt(MYSQL *mysql,mysql_option option,QStringView v)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  int val;
  bool bOk;
  QStringView v_local;
  
  v_local.m_data = v.m_data;
  v_local.m_size = v.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bOk = true;
  val = QStringView::toInt(&v_local,&bOk,10);
  if (bOk == true) {
    iVar2 = mysql_options(mysql,option,&val);
    bVar3 = iVar2 == 0;
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool setOptionInt(MYSQL *mysql, mysql_option option, QStringView v)
{
    bool bOk;
    const auto val = v.toInt(&bOk);
    return bOk ? mysql_options(mysql, option, &val) == 0 : false;
}